

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.c
# Opt level: O3

int jsmn_parse(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,uint num_tokens)

{
  uint uVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  
  uVar15 = parser->pos;
  uVar17 = parser->toknext;
  uVar13 = uVar17;
  uVar14 = uVar17;
  uVar11 = uVar17;
joined_r0x00104fc9:
  uVar7 = (ulong)uVar15;
  if (uVar7 < len) {
    bVar2 = js[uVar7];
    if (0x2b < bVar2) {
      if (bVar2 < 0x5d) {
        if (bVar2 == 0x2c) {
          if ((((tokens != (jsmntok_t *)0x0) && ((long)parser->toksuper != -1)) &&
              (1 < tokens[parser->toksuper].type - JSMN_OBJECT)) &&
             (uVar18 = uVar13 - 1, -1 < (int)uVar18)) {
            piVar10 = &tokens[uVar18].end;
            uVar7 = (ulong)uVar18;
            do {
              if (((((jsmntok_t *)(piVar10 + -2))->type - JSMN_OBJECT < 2) && (piVar10[-1] != -1))
                 && (*piVar10 == -1)) {
                parser->toksuper = (int)uVar7;
                break;
              }
              piVar10 = piVar10 + -4;
              bVar4 = 0 < (long)uVar7;
              uVar7 = uVar7 - 1;
            } while (bVar4);
          }
        }
        else if (bVar2 == 0x3a) {
          parser->toksuper = uVar17 - 1;
          uVar13 = uVar17;
        }
        else {
          if (bVar2 != 0x5b) goto LAB_001051d0;
LAB_0010526b:
          uVar14 = uVar14 + 1;
          if (tokens != (jsmntok_t *)0x0) {
            if (num_tokens <= uVar11) {
              return -1;
            }
            uVar17 = uVar11 + 1;
            parser->toknext = uVar17;
            tokens[uVar11].end = -1;
            tokens[uVar11].size = 0;
            if ((long)parser->toksuper != -1) {
              tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
            }
            tokens[uVar11].type = (bVar2 != 0x7b) + JSMN_OBJECT;
            tokens[uVar11].start = uVar15;
            parser->toksuper = uVar11;
            uVar13 = uVar17;
            uVar11 = uVar17;
          }
        }
      }
      else {
        if (bVar2 != 0x5d) {
          if (bVar2 == 0x7b) goto LAB_0010526b;
          if (bVar2 != 0x7d) goto LAB_001051d0;
        }
        if (tokens != (jsmntok_t *)0x0) {
          uVar18 = uVar11 - 1;
          if ((int)uVar18 < 0) {
            uVar7 = (ulong)uVar11;
          }
          else {
            piVar10 = &tokens[uVar18].end;
            uVar7 = (ulong)uVar18 + 1;
            while ((piVar10[-1] == -1 || (*piVar10 != -1))) {
              piVar10 = piVar10 + -4;
              uVar6 = uVar7 - 1;
              bVar4 = (long)uVar7 < 1;
              uVar7 = uVar6;
              if (uVar6 == 0 || bVar4) {
                return -2;
              }
            }
            if (((jsmntok_t *)(piVar10 + -2))->type != (bVar2 != 0x7d) + JSMN_OBJECT) {
              return -2;
            }
            uVar18 = (int)uVar7 - 1;
            parser->toksuper = -1;
            *piVar10 = uVar15 + 1;
          }
          if ((int)uVar7 == 0) {
            return -2;
          }
          uVar17 = uVar11;
          uVar13 = uVar11;
          if (-1 < (int)uVar18) {
            piVar10 = &tokens[uVar18].end;
            uVar7 = (ulong)uVar18;
            do {
              if ((piVar10[-1] != -1) && (*piVar10 == -1)) {
                parser->toksuper = (int)uVar7;
                break;
              }
              piVar10 = piVar10 + -4;
              bVar4 = 0 < (long)uVar7;
              uVar7 = uVar7 - 1;
            } while (bVar4);
          }
        }
      }
      goto LAB_0010533c;
    }
    if (0xc < bVar2) {
      if ((bVar2 != 0xd) && (bVar2 != 0x20)) {
        if (bVar2 == 0x22) {
          uVar19 = uVar15 + 1;
          uVar7 = (ulong)uVar19;
          parser->pos = uVar19;
          uVar18 = uVar19;
          if (uVar7 < len) {
            do {
              cVar3 = js[uVar7];
              uVar16 = uVar18;
              if (cVar3 == '\\') {
                uVar1 = uVar18 + 1;
                if (uVar1 < len) {
                  parser->pos = uVar1;
                  bVar2 = js[uVar1];
                  uVar16 = uVar1;
                  if ((0x37 < bVar2 - 0x2f) ||
                     ((0x88200000000001U >> ((ulong)(bVar2 - 0x2f) & 0x3f) & 1) == 0)) {
                    iVar5 = -2;
                    switch(bVar2) {
                    case 0x6e:
                    case 0x72:
                    case 0x74:
                      break;
                    case 0x6f:
                    case 0x70:
                    case 0x71:
                    case 0x73:
                      goto switchD_001050be_caseD_6f;
                    case 0x75:
                      uVar18 = uVar18 + 2;
                      parser->pos = uVar18;
                      iVar12 = 4;
                      do {
                        if ((len <= uVar18) || (bVar2 = js[uVar18], bVar2 == 0)) break;
                        if ((9 < (byte)(bVar2 - 0x30)) &&
                           ((0x25 < bVar2 - 0x41 ||
                            ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0))))
                        goto switchD_001050be_caseD_6f;
                        uVar18 = uVar18 + 1;
                        parser->pos = uVar18;
                        iVar12 = iVar12 + -1;
                      } while (iVar12 != 0);
                      uVar16 = uVar18 - 1;
                      break;
                    default:
                      if (bVar2 != 0x22) goto switchD_001050be_caseD_6f;
                    }
                  }
                }
              }
              else {
                if (cVar3 == '\0') break;
                if (cVar3 == '\"') goto LAB_001053d9;
              }
              uVar18 = uVar16 + 1;
              uVar7 = (ulong)uVar18;
              parser->pos = uVar18;
              if (len <= uVar7) break;
            } while( true );
          }
          iVar5 = -3;
          goto switchD_001050be_caseD_6f;
        }
        goto LAB_001051d0;
      }
      goto LAB_0010533c;
    }
    if (bVar2 - 9 < 2) goto LAB_0010533c;
    if (bVar2 != 0) {
LAB_001051d0:
      do {
        uVar18 = (uint)uVar7;
        bVar2 = js[uVar7];
        if (((((ulong)bVar2 < 0x3b) && ((0x400100100002601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
            (bVar2 == 0x5d)) || (bVar2 == 0x7d)) break;
        if ((byte)(bVar2 + 0x81) < 0xa1) {
          iVar5 = -2;
          goto switchD_001050be_caseD_6f;
        }
        uVar18 = uVar18 + 1;
        uVar7 = (ulong)uVar18;
        parser->pos = uVar18;
      } while (uVar7 < len);
      if (tokens != (jsmntok_t *)0x0) {
        if (uVar11 < num_tokens) {
          uVar16 = uVar11 + 1;
          parser->toknext = uVar16;
          tokens[uVar11].type = JSMN_PRIMITIVE;
          tokens[uVar11].start = uVar15;
          tokens[uVar11].end = uVar18;
          tokens[uVar11].size = 0;
          uVar18 = uVar18 - 1;
          uVar13 = uVar16;
          uVar11 = uVar16;
          if ((long)parser->toksuper != -1) {
            tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
          }
          goto LAB_0010542e;
        }
        goto LAB_001054de;
      }
      uVar18 = uVar18 - 1;
      uVar16 = uVar17;
      goto LAB_0010542e;
    }
  }
  if ((tokens != (jsmntok_t *)0x0) && (uVar11 = uVar11 - 1, -1 < (int)uVar11)) {
    piVar10 = &tokens[uVar11].end;
    lVar8 = (ulong)uVar11 + 1;
    do {
      if ((piVar10[-1] != -1) && (*piVar10 == -1)) {
        return -3;
      }
      piVar10 = piVar10 + -4;
      lVar9 = lVar8 + -1;
      bVar4 = 0 < lVar8;
      lVar8 = lVar9;
    } while (lVar9 != 0 && bVar4);
  }
  return uVar14;
LAB_001053d9:
  if (tokens == (jsmntok_t *)0x0) {
    uVar14 = uVar14 + 1;
    uVar15 = uVar18;
  }
  else {
    if (num_tokens <= uVar17) {
LAB_001054de:
      iVar5 = -1;
switchD_001050be_caseD_6f:
      parser->pos = uVar15;
      return iVar5;
    }
    uVar16 = uVar17 + 1;
    parser->toknext = uVar16;
    tokens[uVar17].type = JSMN_STRING;
    tokens[uVar17].start = uVar19;
    tokens[uVar17].end = uVar18;
    tokens[uVar17].size = 0;
    uVar13 = uVar16;
    uVar11 = uVar16;
    if ((long)parser->toksuper != -1) {
      tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
    }
LAB_0010542e:
    uVar14 = uVar14 + 1;
    uVar17 = uVar16;
    uVar15 = uVar18;
  }
LAB_0010533c:
  uVar15 = uVar15 + 1;
  parser->pos = uVar15;
  goto joined_r0x00104fc9;
}

Assistant:

int jsmn_parse(jsmn_parser *parser, const char *js, size_t len,
		jsmntok_t *tokens, unsigned int num_tokens) {
	int r;
	int i;
	jsmntok_t *token;
	int count = parser->toknext;

	for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
		char c;
		jsmntype_t type;

		c = js[parser->pos];
		switch (c) {
			case '{': case '[':
				count++;
				if (tokens == NULL) {
					break;
				}
				token = jsmn_alloc_token(parser, tokens, num_tokens);
				if (token == NULL)
					return JSMN_ERROR_NOMEM;
				if (parser->toksuper != -1) {
					tokens[parser->toksuper].size++;
#ifdef JSMN_PARENT_LINKS
					token->parent = parser->toksuper;
#endif
				}
				token->type = (c == '{' ? JSMN_OBJECT : JSMN_ARRAY);
				token->start = parser->pos;
				parser->toksuper = parser->toknext - 1;
				break;
			case '}': case ']':
				if (tokens == NULL)
					break;
				type = (c == '}' ? JSMN_OBJECT : JSMN_ARRAY);
#ifdef JSMN_PARENT_LINKS
				if (parser->toknext < 1) {
					return JSMN_ERROR_INVAL;
				}
				token = &tokens[parser->toknext - 1];
				for (;;) {
					if (token->start != -1 && token->end == -1) {
						if (token->type != type) {
							return JSMN_ERROR_INVAL;
						}
						token->end = parser->pos + 1;
						parser->toksuper = token->parent;
						break;
					}
					if (token->parent == -1) {
						break;
					}
					token = &tokens[token->parent];
				}
#else
				for (i = parser->toknext - 1; i >= 0; i--) {
					token = &tokens[i];
					if (token->start != -1 && token->end == -1) {
						if (token->type != type) {
							return JSMN_ERROR_INVAL;
						}
						parser->toksuper = -1;
						token->end = parser->pos + 1;
						break;
					}
				}
				/* Error if unmatched closing bracket */
				if (i == -1) return JSMN_ERROR_INVAL;
				for (; i >= 0; i--) {
					token = &tokens[i];
					if (token->start != -1 && token->end == -1) {
						parser->toksuper = i;
						break;
					}
				}
#endif
				break;
			case '\"':
				r = jsmn_parse_string(parser, js, len, tokens, num_tokens);
				if (r < 0) return r;
				count++;
				if (parser->toksuper != -1 && tokens != NULL)
					tokens[parser->toksuper].size++;
				break;
			case '\t' : case '\r' : case '\n' : case ' ':
				break;
			case ':':
				parser->toksuper = parser->toknext - 1;
				break;
			case ',':
				if (tokens != NULL && parser->toksuper != -1 &&
						tokens[parser->toksuper].type != JSMN_ARRAY &&
						tokens[parser->toksuper].type != JSMN_OBJECT) {
#ifdef JSMN_PARENT_LINKS
					parser->toksuper = tokens[parser->toksuper].parent;
#else
					for (i = parser->toknext - 1; i >= 0; i--) {
						if (tokens[i].type == JSMN_ARRAY || tokens[i].type == JSMN_OBJECT) {
							if (tokens[i].start != -1 && tokens[i].end == -1) {
								parser->toksuper = i;
								break;
							}
						}
					}
#endif
				}
				break;
#ifdef JSMN_STRICT
			/* In strict mode primitives are: numbers and booleans */
			case '-': case '0': case '1' : case '2': case '3' : case '4':
			case '5': case '6': case '7' : case '8': case '9':
			case 't': case 'f': case 'n' :
				/* And they must not be keys of the object */
				if (tokens != NULL && parser->toksuper != -1) {
					jsmntok_t *t = &tokens[parser->toksuper];
					if (t->type == JSMN_OBJECT ||
							(t->type == JSMN_STRING && t->size != 0)) {
						return JSMN_ERROR_INVAL;
					}
				}
#else
			/* In non-strict mode every unquoted value is a primitive */
			default:
#endif
				r = jsmn_parse_primitive(parser, js, len, tokens, num_tokens);
				if (r < 0) return r;
				count++;
				if (parser->toksuper != -1 && tokens != NULL)
					tokens[parser->toksuper].size++;
				break;

#ifdef JSMN_STRICT
			/* Unexpected char in strict mode */
			default:
				return JSMN_ERROR_INVAL;
#endif
		}
	}

	if (tokens != NULL) {
		for (i = parser->toknext - 1; i >= 0; i--) {
			/* Unmatched opened object or array */
			if (tokens[i].start != -1 && tokens[i].end == -1) {
				return JSMN_ERROR_PART;
			}
		}
	}

	return count;
}